

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cpp
# Opt level: O2

void __thiscall CaDiCaL::Proof::add_derived_clause(Proof *this)

{
  pointer ppTVar1;
  pointer puVar2;
  pointer piVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  Tracer **tracer;
  pointer ppTVar4;
  
  if (this->lratbuilder != (LratBuilder *)0x0) {
    __x = LratBuilder::add_clause_get_proof(this->lratbuilder,this->clause_id,&this->clause);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(&this->proof_chain,__x);
  }
  ppTVar1 = (this->tracers).
            super__Vector_base<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppTVar4 = (this->tracers).
                 super__Vector_base<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppTVar4 != ppTVar1; ppTVar4 = ppTVar4 + 1) {
    (*(*ppTVar4)->_vptr_Tracer[3])
              (*ppTVar4,this->clause_id,(ulong)this->redundant,&this->clause,&this->proof_chain);
  }
  puVar2 = (this->proof_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->proof_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->proof_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  piVar3 = (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar3) {
    (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar3;
  }
  this->clause_id = 0;
  return;
}

Assistant:

void Proof::add_derived_clause () {
  LOG (clause, "PROOF adding derived external clause (redundant: %d)",
       redundant);
  assert (clause_id);
  if (lratbuilder) {
    proof_chain = lratbuilder->add_clause_get_proof (clause_id, clause);
  }
  for (auto &tracer : tracers) {
    tracer->add_derived_clause (clause_id, redundant, clause, proof_chain);
  }
  proof_chain.clear ();
  clause.clear ();
  clause_id = 0;
}